

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib536.c
# Opt level: O0

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 uVar3;
  CURLM *multi_00;
  timeval tVar4;
  CURLMcode ec_8;
  CURLcode ec_7;
  CURLcode ec_6;
  CURLMcode ec_5;
  CURLcode ec_4;
  CURLcode ec_3;
  CURLcode ec_2;
  CURLMcode ec_1;
  CURLcode ec;
  __suseconds_t local_38;
  int local_2c;
  long lStack_28;
  int res;
  CURL *easy;
  CURLM *multi;
  char *URL_local;
  
  lStack_28 = 0;
  local_2c = 0;
  tVar4 = tutil_tvnow();
  _ec_1 = tVar4.tv_sec;
  tv_test_start.tv_sec = _ec_1;
  local_38 = tVar4.tv_usec;
  tv_test_start.tv_usec = local_38;
  iVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (iVar2 != 0) {
    uVar3 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib536.c"
                  ,0x56,iVar2,uVar3);
    local_2c = iVar2;
  }
  if (local_2c == 0) {
    multi_00 = (CURLM *)curl_multi_init();
    if (multi_00 == (CURLM *)0x0) {
      curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib536.c"
                    ,0x58);
      local_2c = 0x7b;
    }
    if (local_2c == 0) {
      lStack_28 = curl_easy_init();
      if (lStack_28 == 0) {
        curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib536.c"
                      ,0x5a);
        local_2c = 0x7c;
      }
      if (local_2c == 0) {
        iVar2 = curl_multi_setopt(multi_00,3,1);
        uVar1 = _stderr;
        if (iVar2 != 0) {
          uVar3 = curl_multi_strerror(iVar2);
          curl_mfprintf(uVar1,"%s:%d curl_multi_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib536.c"
                        ,0x5c,iVar2,uVar3);
          local_2c = iVar2;
        }
        if (local_2c == 0) {
          iVar2 = curl_easy_setopt(lStack_28,0x4e2b,fwrite);
          uVar1 = _stderr;
          if (iVar2 != 0) {
            uVar3 = curl_easy_strerror(iVar2);
            curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib536.c"
                          ,0x5e,iVar2,uVar3);
            local_2c = iVar2;
          }
          if (local_2c == 0) {
            iVar2 = curl_easy_setopt(lStack_28,0x2d,1);
            uVar1 = _stderr;
            if (iVar2 != 0) {
              uVar3 = curl_easy_strerror(iVar2);
              curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib536.c"
                            ,0x5f,iVar2,uVar3);
              local_2c = iVar2;
            }
            if (local_2c == 0) {
              iVar2 = curl_easy_setopt(lStack_28,0x2712,URL);
              uVar1 = _stderr;
              if (iVar2 != 0) {
                uVar3 = curl_easy_strerror(iVar2);
                curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib536.c"
                              ,0x60,iVar2,uVar3);
                local_2c = iVar2;
              }
              if (local_2c == 0) {
                iVar2 = curl_multi_add_handle(multi_00,lStack_28);
                uVar1 = _stderr;
                if (iVar2 != 0) {
                  uVar3 = curl_multi_strerror(iVar2);
                  curl_mfprintf(uVar1,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib536.c"
                                ,0x62,iVar2,uVar3);
                  local_2c = iVar2;
                }
                if (local_2c == 0) {
                  local_2c = perform(multi_00);
                  if (local_2c == 0) {
                    curl_multi_remove_handle(multi_00,lStack_28);
                    curl_easy_reset(lStack_28);
                    iVar2 = curl_easy_setopt(lStack_28,0x2d,1);
                    uVar1 = _stderr;
                    if (iVar2 != 0) {
                      uVar3 = curl_easy_strerror(iVar2);
                      curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib536.c"
                                    ,0x72,iVar2,uVar3);
                      local_2c = iVar2;
                    }
                    if (local_2c == 0) {
                      iVar2 = curl_easy_setopt(lStack_28,0x2712,libtest_arg2);
                      uVar1 = _stderr;
                      if (iVar2 != 0) {
                        uVar3 = curl_easy_strerror(iVar2);
                        curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib536.c"
                                      ,0x73,iVar2,uVar3);
                        local_2c = iVar2;
                      }
                      if (local_2c == 0) {
                        iVar2 = curl_multi_add_handle(multi_00,lStack_28);
                        uVar1 = _stderr;
                        if (iVar2 != 0) {
                          uVar3 = curl_multi_strerror(iVar2);
                          curl_mfprintf(uVar1,
                                        "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib536.c"
                                        ,0x75,iVar2,uVar3);
                          local_2c = iVar2;
                        }
                        if (local_2c == 0) {
                          local_2c = perform(multi_00);
                          if (local_2c == 0) {
                            curl_multi_remove_handle(multi_00,lStack_28);
                          }
                          else {
                            curl_mprintf("retrieve 2 failed\n");
                          }
                        }
                        else {
                          curl_mprintf("curl_multi_add_handle() 2 failed\n");
                        }
                      }
                    }
                  }
                  else {
                    curl_mprintf("retrieve 1 failed\n");
                  }
                }
                else {
                  curl_mprintf("curl_multi_add_handle() 1 failed\n");
                }
              }
            }
          }
        }
      }
    }
    curl_easy_cleanup(lStack_28);
    curl_multi_cleanup(multi_00);
    curl_global_cleanup();
    curl_mprintf("Finished!\n");
    URL_local._4_4_ = local_2c;
  }
  else {
    URL_local._4_4_ = local_2c;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURLM *multi = NULL;
  CURL *easy = NULL;
  int res = 0;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  multi_init(multi);

  easy_init(easy);

  multi_setopt(multi, CURLMOPT_PIPELINING, 1L);

  easy_setopt(easy, CURLOPT_WRITEFUNCTION, fwrite);
  easy_setopt(easy, CURLOPT_FAILONERROR, 1L);
  easy_setopt(easy, CURLOPT_URL, URL);

  res_multi_add_handle(multi, easy);
  if(res) {
    printf("curl_multi_add_handle() 1 failed\n");
    goto test_cleanup;
  }

  res = perform(multi);
  if(res) {
    printf("retrieve 1 failed\n");
    goto test_cleanup;
  }

  curl_multi_remove_handle(multi, easy);

  curl_easy_reset(easy);

  easy_setopt(easy, CURLOPT_FAILONERROR, 1L);
  easy_setopt(easy, CURLOPT_URL, libtest_arg2);

  res_multi_add_handle(multi, easy);
  if(res) {
    printf("curl_multi_add_handle() 2 failed\n");
    goto test_cleanup;
  }

  res = perform(multi);
  if(res) {
    printf("retrieve 2 failed\n");
    goto test_cleanup;
  }

  curl_multi_remove_handle(multi, easy);

test_cleanup:

  /* undocumented cleanup sequence - type UB */

  curl_easy_cleanup(easy);
  curl_multi_cleanup(multi);
  curl_global_cleanup();

  printf("Finished!\n");

  return res;
}